

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_bitst.cc
# Opt level: O2

ASN1_BIT_STRING *
v2i_ASN1_BIT_STRING(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  char *__s1;
  char *__s2;
  int iVar1;
  ASN1_BIT_STRING *a;
  size_t sVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ulong i;
  
  a = ASN1_BIT_STRING_new();
  if (a != (ASN1_BIT_STRING *)0x0) {
    i = 0;
    do {
      sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
      if (sVar2 <= i) {
        return a;
      }
      puVar3 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)nval,i);
      puVar4 = (undefined8 *)((long)method->usr_data + 0x10);
      while( true ) {
        __s1 = (char *)puVar4[-1];
        if (__s1 == (char *)0x0) goto LAB_002df70a;
        __s2 = (char *)puVar3[1];
        iVar1 = strcmp((char *)*puVar4,__s2);
        if ((iVar1 == 0) || (iVar1 = strcmp(__s1,__s2), iVar1 == 0)) break;
        puVar4 = puVar4 + 3;
      }
      iVar1 = ASN1_BIT_STRING_set_bit(a,*(int *)(puVar4 + -2),1);
      if (iVar1 == 0) goto LAB_002df758;
      i = i + 1;
    } while (puVar4[-1] != 0);
LAB_002df70a:
    ERR_put_error(0x14,0,0x9c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_bitst.cc"
                  ,0x54);
    ERR_add_error_data(6,"section:",*puVar3,",name:",puVar3[1],",value:",puVar3[2]);
LAB_002df758:
    ASN1_BIT_STRING_free(a);
  }
  return (ASN1_BIT_STRING *)0x0;
}

Assistant:

static void *v2i_ASN1_BIT_STRING(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *nval) {
  ASN1_BIT_STRING *bs;
  if (!(bs = ASN1_BIT_STRING_new())) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    const BIT_STRING_BITNAME *bnam;
    for (bnam = reinterpret_cast<const BIT_STRING_BITNAME *>(method->usr_data);
         bnam->lname; bnam++) {
      if (!strcmp(bnam->sname, val->name) || !strcmp(bnam->lname, val->name)) {
        if (!ASN1_BIT_STRING_set_bit(bs, bnam->bitnum, 1)) {
          ASN1_BIT_STRING_free(bs);
          return NULL;
        }
        break;
      }
    }
    if (!bnam->lname) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNKNOWN_BIT_STRING_ARGUMENT);
      X509V3_conf_err(val);
      ASN1_BIT_STRING_free(bs);
      return NULL;
    }
  }
  return bs;
}